

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkField
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  int32 i;
  Tables *pTVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  pointer pcVar4;
  PlaceholderType placeholder_type;
  bool bVar5;
  uint uVar6;
  Type TVar7;
  undefined4 uVar8;
  FieldOptions *pFVar9;
  iterator iVar10;
  DescriptorPool *pDVar11;
  GoogleOnceDynamic *pGVar12;
  string *psVar13;
  long *plVar14;
  size_t sVar15;
  ErrorLocation location;
  _Hash_node_base *p_Var16;
  size_type *psVar17;
  _Hash_node_base *p_Var18;
  anon_union_8_8_13f84498_for_Symbol_2 aVar19;
  ulong uVar20;
  long lVar21;
  _Hash_node_base *p_Var22;
  _Alloc_hider _Var23;
  char *error;
  _Hash_node_base *p_Var24;
  _Hash_node_base *p_Var25;
  _Base_ptr p_Var26;
  Symbol SVar27;
  string name;
  string error_msg;
  size_type __dnew;
  int local_200;
  char local_1fc [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [2];
  string *local_1d8;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [2];
  undefined1 local_180 [48];
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  if (*(long *)(field + 0x80) == 0) {
    pFVar9 = FieldOptions::default_instance();
    *(FieldOptions **)(field + 0x80) = pFVar9;
  }
  FileDescriptorTables::AddFieldByStylizedNames(this->file_tables_,field);
  if (((proto->_has_bits_).has_bits_[0] & 2) != 0) {
    SVar27 = LookupSymbol(this,(proto->extendee_).ptr_,*(string **)(field + 8),
                          PLACEHOLDER_EXTENDABLE_MESSAGE,LOOKUP_ALL,true);
    aVar19 = SVar27.field_1;
    if (SVar27.type == MESSAGE) {
      ((anon_union_8_8_13f84498_for_Symbol_2 *)(field + 0x58))->descriptor = (Descriptor *)aVar19;
      i = *(int32 *)(field + 0x38);
      if (0 < (long)*(int *)(aVar19.descriptor + 0x68)) {
        lVar21 = 0;
        do {
          if ((*(int *)(*(long *)(aVar19.descriptor + 0x70) + lVar21 * 8) <= i) &&
             (i < *(int *)(*(long *)(aVar19.descriptor + 0x70) + 4 + lVar21 * 8)))
          goto LAB_002e66d1;
          lVar21 = lVar21 + 1;
        } while (*(int *)(aVar19.descriptor + 0x68) != lVar21);
      }
      local_1d8 = *(string **)(field + 8);
      name._M_dataplus._M_p = (pointer)**(undefined8 **)(aVar19.descriptor + 8);
      name._M_string_length =
           CONCAT44(name._M_string_length._4_4_,
                    *(undefined4 *)(*(undefined8 **)(aVar19.descriptor + 8) + 1));
      __dnew = (size_type)FastInt32ToBuffer(i,local_1fc);
      sVar15 = strlen((char *)__dnew);
      local_200 = (int)sVar15;
      local_1b0._0_8_ = (_Hash_node_base *)0x0;
      local_1b0._8_4_ = 0xffffffff;
      local_180._0_8_ = (char *)0x0;
      local_180._8_4_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&error_msg,(strings *)"\"$0\" does not declare $1 as an extension number.",
                 (char *)&name,(SubstituteArg *)&__dnew,(SubstituteArg *)local_1b0,
                 (SubstituteArg *)local_180,&local_60,&local_90,&local_c0,&local_f0,&local_120,
                 &local_150,(SubstituteArg *)name._M_dataplus._M_p);
      AddError(this,local_1d8,&proto->super_Message,NUMBER,&error_msg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_msg._M_dataplus._M_p != &error_msg.field_2) {
        operator_delete(error_msg._M_dataplus._M_p,
                        CONCAT44(error_msg.field_2._M_allocated_capacity._4_4_,
                                 error_msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
      goto LAB_002e66d1;
    }
    if (SVar27.type == NULL_SYMBOL) {
      AddNotDefinedError(this,*(string **)(field + 8),&proto->super_Message,EXTENDEE,
                         (proto->extendee_).ptr_);
      return;
    }
    psVar13 = *(string **)(field + 8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew,"\""
                   ,(proto->extendee_).ptr_);
    plVar14 = (long *)std::__cxx11::string::append((char *)&__dnew);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    psVar17 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar17) {
      name.field_2._M_allocated_capacity = *psVar17;
      name.field_2._8_8_ = plVar14[3];
    }
    else {
      name.field_2._M_allocated_capacity = *psVar17;
      name._M_dataplus._M_p = (pointer)*plVar14;
    }
    name._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    AddError(this,psVar13,&proto->super_Message,EXTENDEE,&name);
    goto LAB_002e744e;
  }
LAB_002e66d1:
  if ((*(long *)(field + 0x60) != 0) && (*(int *)(field + 0x4c) != 1)) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,NAME,
             "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
  }
  uVar6 = (proto->_has_bits_).has_bits_[0];
  if ((uVar6 & 4) == 0) {
    if (*(GoogleOnceDynamic **)(field + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(field + 0x40),FieldDescriptor::TypeOnceInit,field);
    }
    uVar6 = *(uint *)(field + 0x48);
    if ((uVar6 & 0xfffffffe) != 10) {
      if (*(GoogleOnceDynamic **)(field + 0x40) != (GoogleOnceDynamic *)0x0) {
        GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                  (*(GoogleOnceDynamic **)(field + 0x40),FieldDescriptor::TypeOnceInit,field);
        uVar6 = *(uint *)(field + 0x48);
      }
      if (uVar6 != 0xe) goto LAB_002e6766;
    }
    psVar13 = *(string **)(field + 8);
    error = "Field with message or enum type missing type_name.";
LAB_002e6756:
    location = TYPE;
LAB_002e6761:
    AddError(this,psVar13,&proto->super_Message,location,error);
  }
  else {
    placeholder_type = uVar6 >> 3 & PLACEHOLDER_ENUM;
    if (proto->type_ == 0xe) {
      placeholder_type = PLACEHOLDER_ENUM;
    }
    SVar27 = LookupSymbol(this,(proto->type_name_).ptr_,*(string **)(field + 8),placeholder_type,
                          LOOKUP_TYPES,(bool)(this->pool_->lazily_build_dependencies_ ^ 1));
    aVar19 = SVar27.field_1;
    TVar7 = SVar27.type;
    if (TVar7 == NULL_SYMBOL) {
      pDVar11 = this->pool_;
      if (pDVar11->enforce_weak_ == false) {
        pFVar9 = proto->options_;
        if (pFVar9 == (FieldOptions *)0x0) {
          pFVar9 = (FieldOptions *)&_FieldOptions_default_instance_;
        }
        if (pFVar9->weak_ == true) {
          __dnew = 0x15;
          name._M_dataplus._M_p = (pointer)&name.field_2;
          name._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&name,(ulong)&__dnew);
          name.field_2._M_allocated_capacity = __dnew;
          builtin_strncpy(name._M_dataplus._M_p,"google.protobuf.Empty",0x15);
          name._M_string_length = __dnew;
          name._M_dataplus._M_p[__dnew] = '\0';
          SVar27 = FindSymbol(this,&name,true);
          aVar19 = SVar27.field_1;
          TVar7 = SVar27.type;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          if (TVar7 != NULL_SYMBOL) goto LAB_002e686e;
          pDVar11 = this->pool_;
        }
      }
      if (pDVar11->lazily_build_dependencies_ != true) {
        AddNotDefinedError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
                           (proto->type_name_).ptr_);
        return;
      }
      psVar13 = (proto->type_name_).ptr_;
      pcVar4 = (psVar13->_M_dataplus)._M_p;
      name._M_dataplus._M_p = (pointer)&name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&name,pcVar4,pcVar4 + psVar13->_M_string_length);
      if (this->pool_->enforce_weak_ == false) {
        pFVar9 = proto->options_;
        if (pFVar9 == (FieldOptions *)0x0) {
          pFVar9 = (FieldOptions *)&_FieldOptions_default_instance_;
        }
        if (pFVar9->weak_ == true) {
          std::__cxx11::string::_M_replace((ulong)&name,0,(char *)name._M_string_length,0x3a6f7c);
        }
      }
      pGVar12 = DescriptorPool::Tables::AllocateOnceDynamic(this->tables_);
      *(GoogleOnceDynamic **)(field + 0x40) = pGVar12;
      psVar13 = DescriptorPool::Tables::AllocateString(this->tables_,&name);
      *(string **)(field + 0x88) = psVar13;
      if (((proto->_has_bits_).has_bits_[0] & 8) != 0) {
        psVar13 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->default_value_).ptr_)
        ;
        *(string **)(field + 0x90) = psVar13;
      }
      FileDescriptorTables::AddFieldByNumber(this->file_tables_,field);
      if (field[0x50] == (FieldDescriptor)0x1) {
        DescriptorPool::Tables::AddExtension(this->tables_,field);
      }
      local_1f8[0]._M_allocated_capacity = name.field_2._M_allocated_capacity;
      _Var23._M_p = name._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p == &name.field_2) {
        return;
      }
      goto LAB_002e7477;
    }
LAB_002e686e:
    if (((proto->_has_bits_).has_bits_[0] & 0x200) == 0) {
      if (TVar7 == MESSAGE) {
        uVar8 = 0xb;
      }
      else {
        if (TVar7 != ENUM) {
          psVar13 = *(string **)(field + 8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__dnew,"\"",(proto->type_name_).ptr_);
          plVar14 = (long *)std::__cxx11::string::append((char *)&__dnew);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar17 = (size_type *)(plVar14 + 2);
          if ((size_type *)*plVar14 == psVar17) {
            name.field_2._M_allocated_capacity = *psVar17;
            name.field_2._8_8_ = plVar14[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar17;
            name._M_dataplus._M_p = (pointer)*plVar14;
          }
          name._M_string_length = plVar14[1];
          *plVar14 = (long)psVar17;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          AddError(this,psVar13,&proto->super_Message,TYPE,&name);
          goto LAB_002e744e;
        }
        uVar8 = 0xe;
      }
      *(undefined4 *)(field + 0x48) = uVar8;
    }
    if (*(GoogleOnceDynamic **)(field + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(field + 0x40),FieldDescriptor::TypeOnceInit,field);
    }
    uVar6 = *(uint *)(field + 0x48);
    if ((uVar6 & 0xfffffffe) != 10) {
      if (*(GoogleOnceDynamic **)(field + 0x40) != (GoogleOnceDynamic *)0x0) {
        GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                  (*(GoogleOnceDynamic **)(field + 0x40),FieldDescriptor::TypeOnceInit,field);
        uVar6 = *(uint *)(field + 0x48);
      }
      if (uVar6 == 0xe) {
        if (TVar7 == ENUM) {
          ((anon_union_8_8_13f84498_for_Symbol_2 *)(field + 0x78))->descriptor =
               (Descriptor *)aVar19;
          if (*(GoogleOnceDynamic **)(field + 0x40) != (GoogleOnceDynamic *)0x0) {
            GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                      (*(GoogleOnceDynamic **)(field + 0x40),FieldDescriptor::TypeOnceInit,field);
            aVar19 = (anon_union_8_8_13f84498_for_Symbol_2)
                     ((anon_union_8_8_13f84498_for_Symbol_2 *)(field + 0x78))->descriptor;
          }
          if (aVar19.descriptor[0x28] == (Descriptor)0x1) {
            field[0x98] = (FieldDescriptor)0x0;
          }
          else if (((byte)field[0x98] & 1) != 0) {
            bVar5 = io::Tokenizer::IsIdentifier((proto->default_value_).ptr_);
            if (!bVar5) {
              psVar13 = *(string **)(field + 8);
              error = "Default value for an enum field must be an identifier.";
              goto LAB_002e6cef;
            }
            psVar13 = (proto->default_value_).ptr_;
            if (*(GoogleOnceDynamic **)(field + 0x40) != (GoogleOnceDynamic *)0x0) {
              GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                        (*(GoogleOnceDynamic **)(field + 0x40),FieldDescriptor::TypeOnceInit,field);
            }
            SVar27 = LookupSymbolNoPlaceholder
                               (this,psVar13,*(string **)(*(long *)(field + 0x78) + 8),LOOKUP_ALL,
                                true);
            pGVar12 = *(GoogleOnceDynamic **)(field + 0x40);
            if (SVar27.type == ENUM_VALUE) {
              lVar21 = *(long *)(SVar27.field_1.descriptor + 0x18);
              if (pGVar12 != (GoogleOnceDynamic *)0x0) {
                GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                          (pGVar12,FieldDescriptor::TypeOnceInit,field);
              }
              if (lVar21 == *(long *)(field + 0x78)) {
                ((anon_union_8_8_13f84498_for_Symbol_2 *)(field + 0xa0))->descriptor =
                     (Descriptor *)SVar27.field_1;
                goto LAB_002e6766;
              }
              pGVar12 = *(GoogleOnceDynamic **)(field + 0x40);
            }
            psVar13 = *(string **)(field + 8);
            if (pGVar12 != (GoogleOnceDynamic *)0x0) {
              GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                        (pGVar12,FieldDescriptor::TypeOnceInit,field);
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_180,"Enum type \"",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (*(long *)(field + 0x78) + 8));
            plVar14 = (long *)std::__cxx11::string::append((char *)local_180);
            p_Var18 = (_Hash_node_base *)(plVar14 + 2);
            if ((_Hash_node_base *)*plVar14 == p_Var18) {
              local_1a0[0]._0_8_ = p_Var18->_M_nxt;
              local_1a0[0]._8_8_ = plVar14[3];
              local_1b0._0_8_ = (_Hash_node_base *)(local_1b0 + 0x10);
            }
            else {
              local_1a0[0]._0_8_ = p_Var18->_M_nxt;
              local_1b0._0_8_ = (_Hash_node_base *)*plVar14;
            }
            local_1b0._8_8_ = plVar14[1];
            *plVar14 = (long)p_Var18;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__dnew,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1b0,(proto->default_value_).ptr_);
            plVar14 = (long *)std::__cxx11::string::append((char *)&__dnew);
            psVar17 = (size_type *)(plVar14 + 2);
            if ((size_type *)*plVar14 == psVar17) {
              name.field_2._M_allocated_capacity = *psVar17;
              name.field_2._8_8_ = plVar14[3];
              name._M_dataplus._M_p = (pointer)&name.field_2;
            }
            else {
              name.field_2._M_allocated_capacity = *psVar17;
              name._M_dataplus._M_p = (pointer)*plVar14;
            }
            name._M_string_length = plVar14[1];
            *plVar14 = (long)psVar17;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            AddError(this,psVar13,&proto->super_Message,DEFAULT_VALUE,&name);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__dnew != local_1f8) {
              operator_delete((void *)__dnew,local_1f8[0]._M_allocated_capacity + 1);
            }
            if ((_Hash_node_base *)local_1b0._0_8_ != (_Hash_node_base *)(local_1b0 + 0x10)) {
              operator_delete((void *)local_1b0._0_8_,
                              (ulong)(local_1a0[0]._M_allocated_capacity + 1));
            }
            if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
              operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
            }
            goto LAB_002e6766;
          }
          if (*(GoogleOnceDynamic **)(field + 0x40) != (GoogleOnceDynamic *)0x0) {
            GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                      (*(GoogleOnceDynamic **)(field + 0x40),FieldDescriptor::TypeOnceInit,field);
            aVar19 = (anon_union_8_8_13f84498_for_Symbol_2)
                     ((anon_union_8_8_13f84498_for_Symbol_2 *)(field + 0x78))->descriptor;
          }
          if (0 < *(int *)(aVar19.descriptor + 0x2c)) {
            if (*(GoogleOnceDynamic **)(field + 0x40) != (GoogleOnceDynamic *)0x0) {
              GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                        (*(GoogleOnceDynamic **)(field + 0x40),FieldDescriptor::TypeOnceInit,field);
              aVar19 = (anon_union_8_8_13f84498_for_Symbol_2)
                       ((anon_union_8_8_13f84498_for_Symbol_2 *)(field + 0x78))->descriptor;
            }
            *(undefined8 *)(field + 0xa0) = *(undefined8 *)(aVar19.descriptor + 0x30);
          }
          goto LAB_002e6766;
        }
        psVar13 = *(string **)(field + 8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew,
                       "\"",(proto->type_name_).ptr_);
        plVar14 = (long *)std::__cxx11::string::append((char *)&__dnew);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar17 = (size_type *)(plVar14 + 2);
        if ((size_type *)*plVar14 == psVar17) {
          name.field_2._M_allocated_capacity = *psVar17;
          name.field_2._8_8_ = plVar14[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar17;
          name._M_dataplus._M_p = (pointer)*plVar14;
        }
        name._M_string_length = plVar14[1];
        *plVar14 = (long)psVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        AddError(this,psVar13,&proto->super_Message,TYPE,&name);
        goto LAB_002e744e;
      }
      psVar13 = *(string **)(field + 8);
      error = "Field with primitive type has type_name.";
      goto LAB_002e6756;
    }
    if (TVar7 != MESSAGE) {
      psVar13 = *(string **)(field + 8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew,
                     "\"",(proto->type_name_).ptr_);
      plVar14 = (long *)std::__cxx11::string::append((char *)&__dnew);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar17 = (size_type *)(plVar14 + 2);
      if ((size_type *)*plVar14 == psVar17) {
        name.field_2._M_allocated_capacity = *psVar17;
        name.field_2._8_8_ = plVar14[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar17;
        name._M_dataplus._M_p = (pointer)*plVar14;
      }
      name._M_string_length = plVar14[1];
      *plVar14 = (long)psVar17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      AddError(this,psVar13,&proto->super_Message,TYPE,&name);
LAB_002e744e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      _Var23._M_p = (pointer)__dnew;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__dnew == local_1f8) {
        return;
      }
      goto LAB_002e7477;
    }
    ((anon_union_8_8_13f84498_for_Symbol_2 *)(field + 0x70))->descriptor = (Descriptor *)aVar19;
    if (field[0x98] == (FieldDescriptor)0x1) {
      psVar13 = *(string **)(field + 8);
      error = "Messages can\'t have default values.";
LAB_002e6cef:
      location = DEFAULT_VALUE;
      goto LAB_002e6761;
    }
  }
LAB_002e6766:
  bVar5 = FileDescriptorTables::AddFieldByNumber(this->file_tables_,field);
  if (bVar5) {
    if (field[0x50] != (FieldDescriptor)0x1) {
      return;
    }
    bVar5 = DescriptorPool::Tables::AddExtension(this->tables_,field);
    if (bVar5) {
      return;
    }
    pTVar1 = this->tables_;
    name._M_dataplus._M_p = *(pointer *)(field + 0x58);
    name._M_string_length = CONCAT44(name._M_string_length._4_4_,*(undefined4 *)(field + 0x38));
    iVar10 = std::
             _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
             ::find(&(pTVar1->extensions_)._M_t,(key_type *)&name);
    if ((_Rb_tree_header *)iVar10._M_node ==
        &(pTVar1->extensions_)._M_t._M_impl.super__Rb_tree_header) {
      p_Var26 = (_Base_ptr)0x0;
    }
    else {
      p_Var26 = iVar10._M_node[1]._M_left;
    }
    name._M_dataplus._M_p =
         FastInt32ToBuffer(*(int32 *)(field + 0x38),(char *)((long)&name._M_string_length + 4));
    sVar15 = strlen(name._M_dataplus._M_p);
    name._M_string_length = CONCAT44(name._M_string_length._4_4_,(int)sVar15);
    __dnew = **(size_type **)(*(long *)(field + 0x58) + 8);
    local_200 = (int)(*(size_type **)(*(long *)(field + 0x58) + 8))[1];
    local_1b0._0_8_ = *(undefined8 *)p_Var26->_M_parent;
    local_1b0._8_4_ = *(undefined4 *)&p_Var26->_M_parent->_M_parent;
    local_180._0_8_ = **(undefined8 **)p_Var26[1]._M_left;
    local_180._8_4_ = *(undefined4 *)(*(undefined8 **)p_Var26[1]._M_left + 1);
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&error_msg,
               (strings *)
               "Extension number $0 has already been used in \"$1\" by extension \"$2\" defined in $3."
               ,(char *)&name,(SubstituteArg *)&__dnew,(SubstituteArg *)local_1b0,
               (SubstituteArg *)local_180,&local_60,&local_90,&local_c0,&local_f0,&local_120,
               &local_150,(SubstituteArg *)name._M_dataplus._M_p);
    AddWarning(this,*(string **)(field + 8),&proto->super_Message,NUMBER,&error_msg);
  }
  else {
    p_Var18 = *(_Hash_node_base **)(field + 0x58);
    uVar2 = (this->file_tables_->fields_by_number_).
            super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
            ._M_h._M_bucket_count;
    p_Var16 = (_Hash_node_base *)((long)p_Var18 * 0xffff + (long)*(int *)(field + 0x38));
    p_Var25 = (_Hash_node_base *)0x0;
    uVar20 = (ulong)p_Var16 % uVar2;
    p_Var3 = (this->file_tables_->fields_by_number_).
             super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
             ._M_h._M_buckets[uVar20];
    if (p_Var3 != (__node_base_ptr)0x0) {
      p_Var24 = p_Var3->_M_nxt;
      p_Var22 = p_Var24[4]._M_nxt;
      p_Var25 = (_Hash_node_base *)0x0;
      while (((p_Var22 != p_Var16 || (p_Var24[1]._M_nxt != p_Var18)) ||
             (*(int *)&p_Var24[2]._M_nxt != *(int *)(field + 0x38)))) {
        p_Var24 = p_Var24->_M_nxt;
        if ((p_Var24 == (_Hash_node_base *)0x0) ||
           (p_Var22 = p_Var24[4]._M_nxt, (ulong)p_Var22 % uVar2 != uVar20)) goto LAB_002e6e2c;
      }
      p_Var25 = p_Var24[3]._M_nxt;
    }
LAB_002e6e2c:
    if (p_Var18 == (_Hash_node_base *)0x0) {
      error_msg._M_dataplus._M_p = (pointer)&error_msg.field_2;
      error_msg.field_2._M_allocated_capacity._0_4_ = 0x6e6b6e75;
      error_msg._M_string_length = 7;
      error_msg.field_2._M_allocated_capacity._4_4_ = 0x6e776f;
    }
    else {
      error_msg._M_dataplus._M_p = (pointer)&error_msg.field_2;
      p_Var16 = (p_Var18[1]._M_nxt)->_M_nxt;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&error_msg,p_Var16,
                 (long)&p_Var16->_M_nxt + (long)&(p_Var18[1]._M_nxt[1]._M_nxt)->_M_nxt);
    }
    local_1d8 = *(string **)(field + 8);
    if (field[0x50] == (FieldDescriptor)0x1) {
      name._M_dataplus._M_p =
           FastInt32ToBuffer(*(int32 *)(field + 0x38),(char *)((long)&name._M_string_length + 4));
      sVar15 = strlen(name._M_dataplus._M_p);
      name._M_string_length = CONCAT44(name._M_string_length._4_4_,(int)sVar15);
      __dnew = (size_type)error_msg._M_dataplus._M_p;
      local_200 = (int)error_msg._M_string_length;
      local_1b0._0_8_ = (p_Var25[1]._M_nxt)->_M_nxt;
      local_1b0._8_4_ = *(undefined4 *)&p_Var25[1]._M_nxt[1]._M_nxt;
      local_180._0_8_ = (char *)0x0;
      local_180._8_4_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_1d0,
                 (strings *)
                 "Extension number $0 has already been used in \"$1\" by extension \"$2\".",
                 (char *)&name,(SubstituteArg *)&__dnew,(SubstituteArg *)local_1b0,
                 (SubstituteArg *)local_180,&local_60,&local_90,&local_c0,&local_f0,&local_120,
                 &local_150,(SubstituteArg *)name._M_dataplus._M_p);
      AddError(this,local_1d8,&proto->super_Message,NUMBER,&local_1d0);
    }
    else {
      name._M_dataplus._M_p =
           FastInt32ToBuffer(*(int32 *)(field + 0x38),(char *)((long)&name._M_string_length + 4));
      sVar15 = strlen(name._M_dataplus._M_p);
      name._M_string_length = CONCAT44(name._M_string_length._4_4_,(int)sVar15);
      __dnew = (size_type)error_msg._M_dataplus._M_p;
      local_200 = (int)error_msg._M_string_length;
      local_1b0._0_8_ = p_Var25->_M_nxt->_M_nxt;
      local_1b0._8_4_ = *(undefined4 *)&p_Var25->_M_nxt[1]._M_nxt;
      local_180._0_8_ = (char *)0x0;
      local_180._8_4_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_1d0,
                 (strings *)"Field number $0 has already been used in \"$1\" by field \"$2\".",
                 (char *)&name,(SubstituteArg *)&__dnew,(SubstituteArg *)local_1b0,
                 (SubstituteArg *)local_180,&local_60,&local_90,&local_c0,&local_f0,&local_120,
                 &local_150,(SubstituteArg *)name._M_dataplus._M_p);
      AddError(this,local_1d8,&proto->super_Message,NUMBER,&local_1d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_msg._M_dataplus._M_p == &error_msg.field_2) {
    return;
  }
  local_1f8[0]._0_8_ =
       CONCAT44(error_msg.field_2._M_allocated_capacity._4_4_,
                error_msg.field_2._M_allocated_capacity._0_4_);
  _Var23._M_p = error_msg._M_dataplus._M_p;
LAB_002e7477:
  operator_delete(_Var23._M_p,local_1f8[0]._0_8_ + 1);
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkField(
    FieldDescriptor* field, const FieldDescriptorProto& proto) {
  if (field->options_ == NULL) {
    field->options_ = &FieldOptions::default_instance();
  }

  // Add the field to the lowercase-name and camelcase-name tables.
  file_tables_->AddFieldByStylizedNames(field);

  if (proto.has_extendee()) {
    Symbol extendee =
        LookupSymbol(proto.extendee(), field->full_name(),
                     DescriptorPool::PLACEHOLDER_EXTENDABLE_MESSAGE);
    if (extendee.IsNull()) {
      AddNotDefinedError(field->full_name(), proto,
                         DescriptorPool::ErrorCollector::EXTENDEE,
                         proto.extendee());
      return;
    } else if (extendee.type != Symbol::MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "\"" + proto.extendee() + "\" is not a message type.");
      return;
    }
    field->containing_type_ = extendee.descriptor;

    const Descriptor::ExtensionRange* extension_range = field->containing_type()
        ->FindExtensionRangeContainingNumber(field->number());

    if (extension_range == NULL) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("\"$0\" does not declare $1 as an "
                                   "extension number.",
                                   field->containing_type()->full_name(),
                                   field->number()));
    }
  }

  if (field->containing_oneof() != NULL) {
    if (field->label() != FieldDescriptor::LABEL_OPTIONAL) {
      // Note that this error will never happen when parsing .proto files.
      // It can only happen if you manually construct a FileDescriptorProto
      // that is incorrect.
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
    }
  }

  if (proto.has_type_name()) {
    // Assume we are expecting a message type unless the proto contains some
    // evidence that it expects an enum type.  This only makes a difference if
    // we end up creating a placeholder.
    bool expecting_enum = (proto.type() == FieldDescriptorProto::TYPE_ENUM) ||
                          proto.has_default_value();

    Symbol type =
        LookupSymbol(proto.type_name(), field->full_name(),
                     expecting_enum ? DescriptorPool::PLACEHOLDER_ENUM
                                    : DescriptorPool::PLACEHOLDER_MESSAGE,
                     LOOKUP_TYPES, !pool_->lazily_build_dependencies_);

    // If the type is a weak type, we change the type to a google.protobuf.Empty field.
    if (type.IsNull() && !pool_->enforce_weak_ && proto.options().weak()) {
      type = FindSymbol(kNonLinkedWeakMessageReplacementName);
    }

    if (type.IsNull()) {
      if (pool_->lazily_build_dependencies_) {
        // Save the symbol names for later for lookup, and allocate the once
        // object needed for the accessors.
        string name = proto.type_name();
        if (!pool_->enforce_weak_ && proto.options().weak()) {
          name = kNonLinkedWeakMessageReplacementName;
        }
        field->type_once_ = tables_->AllocateOnceDynamic();
        field->type_name_ = tables_->AllocateString(name);
        if (proto.has_default_value()) {
          field->default_value_enum_name_ =
              tables_->AllocateString(proto.default_value());
        }
        // AddFieldByNumber and AddExtension are done later in this function,
        // and can/must be done if the field type was not found. The related
        // error checking is not necessary when in lazily_build_dependencies_
        // mode, and can't be done without building the type's descriptor,
        // which we don't want to do.
        file_tables_->AddFieldByNumber(field);
        if (field->is_extension()) {
          tables_->AddExtension(field);
        }
        return;
      } else {
        AddNotDefinedError(field->full_name(), proto,
                           DescriptorPool::ErrorCollector::TYPE,
                           proto.type_name());
        return;
      }
    }

    if (!proto.has_type()) {
      // Choose field type based on symbol.
      if (type.type == Symbol::MESSAGE) {
        field->type_ = FieldDescriptor::TYPE_MESSAGE;
      } else if (type.type == Symbol::ENUM) {
        field->type_ = FieldDescriptor::TYPE_ENUM;
      } else {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a type.");
        return;
      }
    }

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (type.type != Symbol::MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a message type.");
        return;
      }
      field->message_type_ = type.descriptor;

      if (field->has_default_value()) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                 "Messages can't have default values.");
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      if (type.type != Symbol::ENUM) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not an enum type.");
        return;
      }
      field->enum_type_ = type.enum_descriptor;

      if (field->enum_type()->is_placeholder_) {
        // We can't look up default values for placeholder types.  We'll have
        // to just drop them.
        field->has_default_value_ = false;
      }

      if (field->has_default_value()) {
        // Ensure that the default value is an identifier. Parser cannot always
        // verify this because it does not have complete type information.
        // N.B. that this check yields better error messages but is not
        // necessary for correctness (an enum symbol must be a valid identifier
        // anyway), only for better errors.
        if (!io::Tokenizer::IsIdentifier(proto.default_value())) {
          AddError(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Default value for an enum field must be an identifier.");
        } else {
          // We can't just use field->enum_type()->FindValueByName() here
          // because that locks the pool's mutex, which we have already locked
          // at this point.
          Symbol default_value =
            LookupSymbolNoPlaceholder(proto.default_value(),
                                      field->enum_type()->full_name());

          if (default_value.type == Symbol::ENUM_VALUE &&
              default_value.enum_value_descriptor->type() ==
              field->enum_type()) {
            field->default_value_enum_ = default_value.enum_value_descriptor;
          } else {
            AddError(field->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Enum type \"" + field->enum_type()->full_name() +
                     "\" has no value named \"" + proto.default_value() +
                     "\".");
          }
        }
      } else if (field->enum_type()->value_count() > 0) {
        // All enums must have at least one value, or we would have reported
        // an error elsewhere.  We use the first defined value as the default
        // if a default is not explicitly defined.
        field->default_value_enum_ = field->enum_type()->value(0);
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with primitive type has type_name.");
    }
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with message or enum type missing type_name.");
    }
  }

  // Add the field to the fields-by-number table.
  // Note:  We have to do this *after* cross-linking because extensions do not
  // know their containing type until now. If we're in
  // lazily_build_dependencies_ mode, we're guaranteed there's no errors, so no
  // risk to calling containing_type() or other accessors that will build
  // dependencies.
  if (!file_tables_->AddFieldByNumber(field)) {
    const FieldDescriptor* conflicting_field =
      file_tables_->FindFieldByNumber(field->containing_type(),
                                      field->number());
    string containing_type_name = field->containing_type() == NULL
                                      ? "unknown"
                                      : field->containing_type()->full_name();
    if (field->is_extension()) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Extension number $0 has already been used "
                                   "in \"$1\" by extension \"$2\".",
                                   field->number(),
                                   containing_type_name,
                                   conflicting_field->full_name()));
    } else {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Field number $0 has already been used in "
                                   "\"$1\" by field \"$2\".",
                                   field->number(),
                                   containing_type_name,
                                   conflicting_field->name()));
    }
  } else {
    if (field->is_extension()) {
      if (!tables_->AddExtension(field)) {
        const FieldDescriptor* conflicting_field =
            tables_->FindExtension(field->containing_type(), field->number());
        string error_msg = strings::Substitute(
            "Extension number $0 has already been used in \"$1\" by extension "
            "\"$2\" defined in $3.",
            field->number(),
            field->containing_type()->full_name(),
            conflicting_field->full_name(),
            conflicting_field->file()->name());
        // Conflicting extension numbers should be an error. However, before
        // turning this into an error we need to fix all existing broken
        // protos first.
        // TODO(xiaofeng): Change this to an error.
        AddWarning(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::NUMBER, error_msg);
      }
    }
  }
}